

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

void wstran_pipe_send_cancel(nni_aio *aio,void *arg,int rv)

{
  ws_pipe *p;
  int rv_local;
  void *arg_local;
  nni_aio *aio_local;
  
  nni_mtx_lock((nni_mtx *)arg);
  if (*(nni_aio **)((long)arg + 0x30) == aio) {
    *(undefined8 *)((long)arg + 0x30) = 0;
    nni_aio_abort((nni_aio *)((long)arg + 0x40),rv);
    nni_aio_finish_error(aio,rv);
    nni_mtx_unlock((nni_mtx *)arg);
  }
  else {
    nni_mtx_unlock((nni_mtx *)arg);
  }
  return;
}

Assistant:

static void
wstran_pipe_send_cancel(nni_aio *aio, void *arg, int rv)
{
	ws_pipe *p = arg;
	nni_mtx_lock(&p->mtx);
	if (p->user_txaio != aio) {
		nni_mtx_unlock(&p->mtx);
		return;
	}
	p->user_txaio = NULL;
	nni_aio_abort(&p->txaio, rv);
	nni_aio_finish_error(aio, rv);
	nni_mtx_unlock(&p->mtx);
}